

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O3

void __thiscall
Js::JavascriptBigInt::MulThenAdd(JavascriptBigInt *this,digit_t digitMul,digit_t digitAdd)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong *puVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (digitMul == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x166,"(digitMul != 0)","digitMul != 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  puVar5 = (this->m_digits).ptr;
  TVar1 = this->m_length;
  if (puVar5 < puVar5 + TVar1) {
    puVar6 = puVar5;
    do {
      uVar10 = *puVar6 & 0xffffffff;
      uVar9 = *puVar6 >> 0x20;
      uVar12 = uVar10 * (digitMul & 0xffffffff);
      uVar10 = uVar10 * (digitMul >> 0x20);
      uVar8 = uVar9 * (digitMul & 0xffffffff);
      uVar13 = uVar10 << 0x20;
      uVar11 = ((ulong)(uint)((int)uVar10 + (int)uVar8) << 0x20) + uVar12;
      uVar7 = (ulong)CARRY8(uVar13,uVar12) + 1;
      if (uVar13 + uVar12 <= uVar11) {
        uVar7 = (ulong)CARRY8(uVar13,uVar12);
      }
      uVar12 = uVar11 + digitAdd;
      digitAdd = (ulong)(CARRY8(uVar11,digitAdd) && digitAdd != 0) +
                 (uVar8 >> 0x20) + uVar9 * (digitMul >> 0x20) + (uVar10 >> 0x20) + uVar7;
      *puVar6 = uVar12;
      puVar6 = puVar6 + 1;
    } while (puVar6 < puVar5 + TVar1);
  }
  if (digitAdd != 0) {
    uVar7 = this->m_length;
    if (this->m_maxLength <= uVar7) {
      Resize(this,uVar7 + 1);
      puVar5 = (this->m_digits).ptr;
      uVar7 = this->m_length;
    }
    this->m_length = uVar7 + 1;
    puVar5[uVar7] = digitAdd;
  }
  return;
}

Assistant:

void JavascriptBigInt::MulThenAdd(digit_t digitMul, digit_t digitAdd)
    {
        Assert(digitMul != 0);

        digit_t carryDigit = 0;
        digit_t *pDigit = m_digits;
        digit_t *pDigitLimit = pDigit + m_length;

        for (; pDigit < pDigitLimit; pDigit++)
        {
            *pDigit = JavascriptBigInt::MulDigit(*pDigit, digitMul, &carryDigit);// return low Digit to digit, hight Digit to carry
            if (digitAdd > 0)
            {
                *pDigit = JavascriptBigInt::AddDigit(*pDigit, digitAdd, &carryDigit);// add carry to result
            }
            digitAdd = carryDigit;
        }
        if (0 < digitAdd) // length increase by 1
        {
            if (m_length >= m_maxLength)
            {
                Resize(m_length + 1);
            }
            m_digits[m_length++] = digitAdd;
        }
    }